

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void __thiscall cmSystemToolsArgV::~cmSystemToolsArgV(cmSystemToolsArgV *this)

{
  char *__ptr;
  char **ppcVar1;
  
  ppcVar1 = this->ArgV;
  if (ppcVar1 != (char **)0x0) {
    __ptr = *ppcVar1;
    while (__ptr != (char *)0x0) {
      ppcVar1 = ppcVar1 + 1;
      free(__ptr);
      __ptr = *ppcVar1;
    }
  }
  free(this->ArgV);
  return;
}

Assistant:

~cmSystemToolsArgV()
    {
    for(char** arg = this->ArgV; arg && *arg; ++arg)
      {
      free(*arg);
      }
    free(this->ArgV);
    }